

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O1

deUint32 deStringHashLeading(char *str,int numLeadingChars)

{
  deUint32 dVar1;
  long lVar2;
  
  if (numLeadingChars == 0) {
    return 0x1505;
  }
  dVar1 = 0x1505;
  lVar2 = 0;
  do {
    if (str[lVar2] == '\0') {
      return dVar1;
    }
    dVar1 = dVar1 * 0x21 + (int)str[lVar2];
    lVar2 = lVar2 + 1;
  } while (numLeadingChars != (int)lVar2);
  return dVar1;
}

Assistant:

deUint32 deStringHashLeading (const char* str, int numLeadingChars)
{
	deUint32 hash = 5381;
	unsigned int c;

	DE_ASSERT(str);
	while (numLeadingChars-- && (c = (unsigned int)*str++) != 0)
		hash = (hash << 5) + hash + c;

	return hash;
}